

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t UnitAlignment;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  
  uVar7 = pTexInfo->MaxLod;
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
     (uVar6 = (pTexInfo->Alignment).MipTailStartLod, uVar6 <= uVar7)) {
    uVar7 = uVar6;
  }
  UnitAlignment = (pTexInfo->Alignment).VAlign;
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (pTexInfo->MSAA).NumSamples;
  }
  uVar1 = GmmTextureCalc::ExpandHeight
                    (&this->super_GmmTextureCalc,pTexInfo->BaseHeight,UnitAlignment,uVar1);
  if (uVar7 == 0) {
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar5 = 1;
    uVar6 = 0;
    uVar8 = 0;
    do {
      uVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,uVar5);
      uVar3 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar3 = (pTexInfo->MSAA).NumSamples;
      }
      uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar2,UnitAlignment,uVar3);
      uVar3 = uVar2;
      if ((int)uVar5 == 1) {
        uVar3 = 0;
        uVar8 = uVar2;
      }
      uVar6 = uVar6 + uVar3;
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 <= uVar7);
  }
  if (uVar6 < uVar8) {
    uVar6 = uVar8;
  }
  return uVar6 + uVar1;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign;
    uint32_t AlignedHeightLines;

    GMM_DPF_ENTER;

    MipHeight = pTexInfo->BaseHeight;
    MipLevel  = pTexInfo->MaxLod;
    VAlign    = pTexInfo->Alignment.VAlign;

    MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;


    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    // Height of Mip1 and Mip2..n needed later...
    HeightLinesLevel1 = HeightLinesLevel2 = 0;
    for(i = 1; i <= MipLevel; i++)
    {
        MipHeight = GmmTexGetMipHeight(pTexInfo, i);

        AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

        if(i == 1)
        {
            HeightLinesLevel1 = AlignedHeightLines;
        }
        else
        {
            HeightLinesLevel2 += AlignedHeightLines;
        }
    }

    // If Mip1 height covers all others, then that is all we need...
    if(HeightLinesLevel1 >= HeightLinesLevel2)
    {
        BlockHeight += HeightLinesLevel1;
    }
    else
    {
        BlockHeight += HeightLinesLevel2;
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}